

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O0

void resize_getline(gamewin *gw)

{
  wchar_t local_28;
  wchar_t local_24;
  wchar_t starty;
  wchar_t startx;
  wchar_t width;
  wchar_t height;
  gamewin *gw_local;
  
  if (gw->win == (WINDOW_conflict *)0x0) {
    local_24 = L'\xffffffff';
  }
  else {
    local_24 = gw->win->_maxy + L'\x01';
  }
  startx = local_24;
  if (gw->win == (WINDOW_conflict *)0x0) {
    local_28 = L'\xffffffff';
  }
  else {
    local_28 = gw->win->_maxx + L'\x01';
  }
  starty = local_28;
  if (_LINES < local_24) {
    startx = _LINES;
  }
  if (_COLS < local_28) {
    starty = _COLS;
  }
  mvwin(gw->win,(_LINES - startx) / 2,(_COLS - starty) / 2);
  wresize(gw->win,startx,starty);
  return;
}

Assistant:

static void resize_getline(struct gamewin *gw)
{
    int height, width, startx, starty;
    
    getmaxyx(gw->win, height, width);
    if (height > LINES) height = LINES;
    if (width > COLS) width = COLS;
    
    starty = (LINES - height) / 2;
    startx = (COLS - width) / 2;
    
    mvwin(gw->win, starty, startx);
    wresize(gw->win, height, width);
}